

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
          (tag_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *owner,string_t *name
          ,bool is_mandatory)

{
  this->_vptr_tag_t = (_func_int **)&PTR__tag_t_001369c0;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  this->m_is_mandatory = is_mandatory;
  this->m_is_defined = false;
  (this->m_child_tags).
  super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_child_tags).
  super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_child_tags).
    super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  *(undefined4 *)&this->m_line_number = 0xffffffff;
  *(undefined4 *)((long)&this->m_line_number + 4) = 0xffffffff;
  *(undefined4 *)&this->m_column_number = 0xffffffff;
  *(undefined4 *)((long)&this->m_column_number + 4) = 0xffffffff;
  add_child(owner,this);
  return;
}

Assistant:

tag_t( tag_t< Trait > & owner, const typename Trait::string_t & name,
		bool is_mandatory = false )
		:   m_name( name )
		,   m_is_mandatory( is_mandatory )
		,   m_is_defined( false )
		,	m_parent( nullptr )
		,	m_line_number( -1 )
		,	m_column_number( -1 )
	{
		owner.add_child( *this );
	}